

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPUDPv4Transmitter::ClearIgnoreList(RTPUDPv4Transmitter *this)

{
  RTPUDPv4Transmitter *this_local;
  
  if ((((this->init & 1U) != 0) && ((this->created & 1U) != 0)) && (this->receivemode == IgnoreSome)
     ) {
    ClearAcceptIgnoreInfo(this);
  }
  return;
}

Assistant:

void RTPUDPv4Transmitter::ClearIgnoreList()
{
	if (!init)
		return;
	
	MAINMUTEX_LOCK
	if (created && receivemode == RTPTransmitter::IgnoreSome)
		ClearAcceptIgnoreInfo();
	MAINMUTEX_UNLOCK
}